

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_simplex_node(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  REF_CELL *ppRVar5;
  long lVar6;
  
  ref_node = ref_grid->node;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    ppRVar5 = ref_grid->cell + 8;
  }
  else {
    ppRVar5 = ref_grid->cell + 3;
  }
  iVar3 = ref_node->max;
  if (iVar3 < 1) {
    uVar4 = 0;
  }
  else {
    pRVar1 = *ppRVar5;
    lVar6 = 0;
    bVar2 = 0;
    do {
      if ((-1 < ref_node->global[lVar6]) &&
         ((pRVar1->ref_adj->nnode <= lVar6 || (pRVar1->ref_adj->first[lVar6] == -1)))) {
        uVar4 = ref_node_location(ref_node,(REF_INT)lVar6);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x2e,"ref_validation_simplex_node",(ulong)uVar4,"location");
          return uVar4;
        }
        iVar3 = ref_node->max;
        bVar2 = 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
    uVar4 = (uint)bVar2;
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_validation_simplex_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_BOOL problem;

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  problem = REF_FALSE;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_cell_node_empty(ref_cell, node)) {
      problem = REF_TRUE;
      RSS(ref_node_location(ref_node, node), "location");
    }
  }

  return (problem ? REF_FAILURE : REF_SUCCESS);
}